

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  TypeParam mtx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  AssertHelper local_e8;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c0;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_a8;
  
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)&local_a8);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_e8.data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_e0,(testing *)&local_e8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c0,(PolymorphicMatcher *)&local_e0);
    if (local_e0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.unlock_shared()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x163,(DeathTest **)&local_f0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c0);
    _Var1._M_head_impl = local_f0._M_head_impl;
    if (!bVar3) goto LAB_0019653f;
    if ((element_type *)local_f0._M_head_impl == (element_type *)0x0) goto LAB_00196595;
    iVar5 = (**(code **)(*(long *)local_f0._M_head_impl + 0x10))(local_f0._M_head_impl);
    _Var2._M_head_impl = local_f0._M_head_impl;
    if (iVar5 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_e0,6);
      iVar5 = (**(code **)(*(char **)&(local_f0._M_head_impl)->field_0x0 + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_e0,iVar5);
      cVar4 = (**(code **)(*(long *)_Var2._M_head_impl + 0x20))(_Var2._M_head_impl,bVar3);
      if (cVar4 == '\0') {
        (**(code **)(*(long *)_Var1._M_head_impl + 8))(_Var1._M_head_impl);
        goto LAB_0019653f;
      }
    }
    else if (iVar5 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
                  (&local_a8);
      }
      (**(code **)(*(char **)&(local_f0._M_head_impl)->field_0x0 + 0x28))(local_f0._M_head_impl,2);
      (**(code **)(*(long *)_Var2._M_head_impl + 0x28))(_Var2._M_head_impl,0);
    }
    pcVar6 = *(char **)_Var1._M_head_impl;
    local_e0.impl_.regex_.
    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var1._M_head_impl;
  }
  else {
LAB_0019653f:
    testing::Message::Message((Message *)&local_e0);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x163,pcVar6);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_e0.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_00196595;
    pcVar6 = (local_e0.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
  }
  (**(code **)(pcVar6 + 8))
            (local_e0.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_00196595:
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)&local_a8);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, InvalidUnlockShared0) {
  TypeParam mtx;
  EXPECT_CHECK_FAILURE(mtx.unlock_shared());
}